

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

bool Potassco::parseUnsigned(char **x,unsigned_long_long *out,unsigned_long_long uMax)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *in_RAX;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  char *err;
  
  pcVar2 = *x;
  if (((pcVar2 == (char *)0x0) || (cVar1 = *pcVar2, cVar1 == '\0')) ||
     ((cVar1 == '-' && (pcVar2[1] != '1')))) {
    return false;
  }
  lVar6 = 4;
  err = in_RAX;
  iVar3 = strncmp(pcVar2,"imax",4);
  if (iVar3 != 0) {
    lVar6 = 4;
    iVar3 = strncmp(pcVar2,"umax",4);
    if (iVar3 != 0) {
      if ((cVar1 != '-') || (pcVar2[1] != '1')) {
        iVar3 = detectBase(pcVar2);
        uVar4 = strtoull(pcVar2,&err,iVar3);
        *out = uVar4;
        if (uVar4 == 0xffffffffffffffff) {
          piVar5 = __errno_location();
          if (*piVar5 == 0x22) {
            *piVar5 = 0;
            pcVar2 = *x;
            iVar3 = detectBase(pcVar2);
            uVar4 = strtoull(pcVar2,(char **)0x0,iVar3);
            if (*piVar5 == 0x22) {
              return false;
            }
            if (*out != uVar4) {
              return false;
            }
          }
          else {
            uVar4 = 0xffffffffffffffff;
          }
        }
        if (uVar4 <= uMax && err != *x) {
          *x = err;
          return true;
        }
        return false;
      }
      lVar6 = 2;
    }
  }
  *out = uMax >> (cVar1 == 'i');
  *x = pcVar2 + lVar6;
  return true;
}

Assistant:

static bool parseUnsigned(const char*& x, unsigned long long& out, unsigned long long uMax) {
	if (!x || !*x || (*x == '-' && x[1] != '1')) {
		return false;
	}
	std::size_t len = 4;
	if (std::strncmp(x, "imax", len) == 0 || std::strncmp(x, "umax", len) == 0 || std::strncmp(x, "-1", len=2) == 0) {
		out = *x != 'i' ? uMax : uMax >> 1;
		x  += len;
		return true;
	}
	char* err;
	out = strtoull(x, &err, detectBase(x));
	if (out == ULLONG_MAX && errno == ERANGE) {
		errno = 0;
		unsigned long long temp = strtoull(x, 0, detectBase(x));
		if (errno == ERANGE || out != temp) {
			return false;
		}
	}
	if (err == x || out > uMax) {
		return false;
	}
	x = err;
	return true;
}